

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

DnssecPrefixEntry * __thiscall
BinHash<DnssecPrefixEntry>::DoInsert
          (BinHash<DnssecPrefixEntry> *this,DnssecPrefixEntry *key,bool need_alloc,bool *stored)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  byte local_49;
  DnssecPrefixEntry *local_40;
  DnssecPrefixEntry *oldKey;
  DnssecPrefixEntry *pDStack_30;
  uint32_t hash_index;
  DnssecPrefixEntry *retKey;
  bool *stored_local;
  bool need_alloc_local;
  DnssecPrefixEntry *key_local;
  BinHash<DnssecPrefixEntry> *this_local;
  
  pDStack_30 = (DnssecPrefixEntry *)0x0;
  *stored = false;
  if ((key != (DnssecPrefixEntry *)0x0) && (this->tableSize != 0)) {
    uVar2 = DnssecPrefixEntry::Hash(key);
    uVar3 = uVar2 % this->tableSize;
    local_40 = this->hashBin[uVar3];
    while( true ) {
      local_49 = 0;
      if (local_40 != (DnssecPrefixEntry *)0x0) {
        bVar1 = DnssecPrefixEntry::IsSameKey(key,local_40);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      local_40 = local_40->HashNext;
    }
    if (local_40 == (DnssecPrefixEntry *)0x0) {
      pDStack_30 = key;
      if (need_alloc) {
        pDStack_30 = DnssecPrefixEntry::CreateCopy(key);
      }
      if (pDStack_30 != (DnssecPrefixEntry *)0x0) {
        pDStack_30->HashNext = this->hashBin[uVar3];
        this->hashBin[uVar3] = pDStack_30;
        *stored = true;
        this->tableCount = this->tableCount + 1;
      }
    }
    else {
      DnssecPrefixEntry::Add(local_40,key);
      pDStack_30 = local_40;
      *stored = false;
    }
  }
  return pDStack_30;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }